

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O1

Nwk_Obj_t * Nwk_ManCreateCo(Nwk_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Nwk_Obj_t *pNVar3;
  void **ppvVar4;
  int iVar5;
  
  pNVar3 = Nwk_ManCreateObj(p,1,1);
  *(uint *)&pNVar3->field_0x20 = *(uint *)&pNVar3->field_0x20 & 0x7f | p->vCos->nSize << 7;
  pVVar2 = p->vCos;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_008df3bb;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar4;
    }
    pVVar2->nCap = iVar5;
  }
LAB_008df3bb:
  iVar5 = pVVar2->nSize;
  pVVar2->nSize = iVar5 + 1;
  pVVar2->pArray[iVar5] = pNVar3;
  *(uint *)&pNVar3->field_0x20 = *(uint *)&pNVar3->field_0x20 & 0xfffffff8 | 2;
  p->nObjs[2] = p->nObjs[2] + 1;
  return pNVar3;
}

Assistant:

Nwk_Obj_t * Nwk_ManCreateCo( Nwk_Man_t * p )
{
    Nwk_Obj_t * pObj;
    pObj = Nwk_ManCreateObj( p, 1, 1 );
    pObj->PioId = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = NWK_OBJ_CO;
    p->nObjs[NWK_OBJ_CO]++;
    return pObj;
}